

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000197250 = 0x2e2e2e2e2e2e2e;
    uRam0000000000197257._0_1_ = '.';
    uRam0000000000197257._1_1_ = '.';
    uRam0000000000197257._2_1_ = '.';
    uRam0000000000197257._3_1_ = '.';
    uRam0000000000197257._4_1_ = '.';
    uRam0000000000197257._5_1_ = '.';
    uRam0000000000197257._6_1_ = '.';
    uRam0000000000197257._7_1_ = '.';
    DAT_00197240 = '.';
    DAT_00197240_1._0_1_ = '.';
    DAT_00197240_1._1_1_ = '.';
    DAT_00197240_1._2_1_ = '.';
    DAT_00197240_1._3_1_ = '.';
    DAT_00197240_1._4_1_ = '.';
    DAT_00197240_1._5_1_ = '.';
    DAT_00197240_1._6_1_ = '.';
    uRam0000000000197248 = 0x2e2e2e2e2e2e2e;
    DAT_0019724f = 0x2e;
    DAT_00197230 = '.';
    DAT_00197230_1._0_1_ = '.';
    DAT_00197230_1._1_1_ = '.';
    DAT_00197230_1._2_1_ = '.';
    DAT_00197230_1._3_1_ = '.';
    DAT_00197230_1._4_1_ = '.';
    DAT_00197230_1._5_1_ = '.';
    DAT_00197230_1._6_1_ = '.';
    uRam0000000000197238._0_1_ = '.';
    uRam0000000000197238._1_1_ = '.';
    uRam0000000000197238._2_1_ = '.';
    uRam0000000000197238._3_1_ = '.';
    uRam0000000000197238._4_1_ = '.';
    uRam0000000000197238._5_1_ = '.';
    uRam0000000000197238._6_1_ = '.';
    uRam0000000000197238._7_1_ = '.';
    DAT_00197220 = '.';
    DAT_00197220_1._0_1_ = '.';
    DAT_00197220_1._1_1_ = '.';
    DAT_00197220_1._2_1_ = '.';
    DAT_00197220_1._3_1_ = '.';
    DAT_00197220_1._4_1_ = '.';
    DAT_00197220_1._5_1_ = '.';
    DAT_00197220_1._6_1_ = '.';
    uRam0000000000197228._0_1_ = '.';
    uRam0000000000197228._1_1_ = '.';
    uRam0000000000197228._2_1_ = '.';
    uRam0000000000197228._3_1_ = '.';
    uRam0000000000197228._4_1_ = '.';
    uRam0000000000197228._5_1_ = '.';
    uRam0000000000197228._6_1_ = '.';
    uRam0000000000197228._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000197218._0_1_ = '.';
    uRam0000000000197218._1_1_ = '.';
    uRam0000000000197218._2_1_ = '.';
    uRam0000000000197218._3_1_ = '.';
    uRam0000000000197218._4_1_ = '.';
    uRam0000000000197218._5_1_ = '.';
    uRam0000000000197218._6_1_ = '.';
    uRam0000000000197218._7_1_ = '.';
    DAT_0019725f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}